

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint zlib_decompress(uchar **out,size_t *outsize,size_t expected_size,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  undefined1 local_58 [8];
  ucvector v;
  uint error;
  LodePNGDecompressSettings *settings_local;
  size_t insize_local;
  uchar *in_local;
  size_t expected_size_local;
  size_t *outsize_local;
  uchar **out_local;
  
  if (settings->custom_zlib ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0) {
    ucvector_init((ucvector *)local_58,*out,*outsize);
    if (expected_size != 0) {
      ucvector_resize((ucvector *)local_58,*outsize + expected_size);
      v.data = (uchar *)*outsize;
    }
    v.allocsize._4_4_ = lodepng_zlib_decompressv((ucvector *)local_58,in,insize,settings);
    *out = (uchar *)local_58;
    *outsize = (size_t)v.data;
  }
  else {
    v.allocsize._4_4_ = (*settings->custom_zlib)(out,outsize,in,insize,settings);
    if (((v.allocsize._4_4_ != 0) && (v.allocsize._4_4_ = 0x6e, settings->max_output_size != 0)) &&
       (settings->max_output_size < *outsize)) {
      v.allocsize._4_4_ = 0x6d;
    }
  }
  return v.allocsize._4_4_;
}

Assistant:

static unsigned zlib_decompress(unsigned char** out, size_t* outsize, size_t expected_size,
                                const unsigned char* in, size_t insize, const LodePNGDecompressSettings* settings) {
  unsigned error;
  if(settings->custom_zlib) {
    error = settings->custom_zlib(out, outsize, in, insize, settings);
    if(error) {
      /*the custom zlib is allowed to have its own error codes, however, we translate it to code 110*/
      error = 110;
      /*if there's a max output size, and the custom zlib returned error, then indicate that error instead*/
      if(settings->max_output_size && *outsize > settings->max_output_size) error = 109;
    }
  } else {
    ucvector v = ucvector_init(*out, *outsize);
    if(expected_size) {
      /*reserve the memory to avoid intermediate reallocations*/
      ucvector_resize(&v, *outsize + expected_size);
      v.size = *outsize;
    }
    error = lodepng_zlib_decompressv(&v, in, insize, settings);
    *out = v.data;
    *outsize = v.size;
  }
  return error;
}